

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall
cmComputeLinkDepends::cmComputeLinkDepends
          (cmComputeLinkDepends *this,cmGeneratorTarget *target,string *config,string *linkLanguage)

{
  cmGeneratorTarget *this_00;
  anon_class_32_4_b747d6b6 __f;
  anon_class_16_2_93cd9da3 __f_00;
  bool bVar1;
  byte bVar2;
  cmTargetLinkLibraryType cVar3;
  cmMakefile *pcVar4;
  cmLocalGenerator *pcVar5;
  cmGlobalGenerator *pcVar6;
  cmake *pcVar7;
  const_iterator cVar8;
  const_iterator __last;
  string *psVar9;
  size_type sVar10;
  static_string_view sVar11;
  string_view sep;
  allocator<char> local_2d1;
  string local_2d0;
  undefined1 local_2b0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_250;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_248;
  value_type *local_240;
  value_type *feature;
  char *pcStack_230;
  value_type *local_228;
  char *pcStack_220;
  string_view local_218;
  undefined1 local_208 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  overrideList;
  undefined1 local_1d0 [8];
  string overrideValue;
  string local_1a8;
  undefined1 local_188 [24];
  cmGeneratorExpressionDAGChecker dag;
  string local_f0;
  cmValue local_d0;
  cmValue linkLibraryOverride;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *keys;
  char *pcStack_50;
  _Base_ptr p_Stack_48;
  string_view lloPrefix;
  string *linkLanguage_local;
  string *config_local;
  cmGeneratorTarget *target_local;
  cmComputeLinkDepends *this_local;
  
  std::__cxx11::string::string((string *)&this->LinkLanguage);
  std::__cxx11::string::string((string *)&this->Config);
  std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
  vector(&this->FinalLinkEntries);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->LinkLibraryOverride);
  std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
  vector(&this->EntryList);
  std::
  map<cmLinkItem,_unsigned_long,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_unsigned_long>_>_>
  ::map(&this->LinkEntryIndex);
  std::
  map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::map(&this->GroupItems);
  std::
  queue<cmComputeLinkDepends::BFSEntry,std::deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>>
  ::
  queue<std::deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>,void>
            ((queue<cmComputeLinkDepends::BFSEntry,std::deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>>
              *)&this->BFSQueue);
  std::
  queue<cmComputeLinkDepends::SharedDepEntry,std::deque<cmComputeLinkDepends::SharedDepEntry,std::allocator<cmComputeLinkDepends::SharedDepEntry>>>
  ::
  queue<std::deque<cmComputeLinkDepends::SharedDepEntry,std::allocator<cmComputeLinkDepends::SharedDepEntry>>,void>
            ((queue<cmComputeLinkDepends::SharedDepEntry,std::deque<cmComputeLinkDepends::SharedDepEntry,std::allocator<cmComputeLinkDepends::SharedDepEntry>>>
              *)&this->SharedDepQueue);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            (&this->SharedDepFollowed);
  std::
  vector<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
  ::vector(&this->InferredDependSets);
  cmGraphAdjacencyList::cmGraphAdjacencyList(&this->EntryConstraintGraph);
  std::vector<char,_std::allocator<char>_>::vector(&this->ComponentVisited);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->ComponentOrder);
  std::
  map<unsigned_long,_cmComputeLinkDepends::PendingComponent,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cmComputeLinkDepends::PendingComponent>_>_>
  ::map(&this->PendingComponents);
  std::unique_ptr<cmComputeComponentGraph,std::default_delete<cmComputeComponentGraph>>::
  unique_ptr<std::default_delete<cmComputeComponentGraph>,void>
            ((unique_ptr<cmComputeComponentGraph,std::default_delete<cmComputeComponentGraph>> *)
             &this->CCG);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->FinalLinkOrder);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->OriginalEntries);
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::set(&this->OldWrongConfigItems);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->ObjectEntries);
  this->Target = target;
  pcVar4 = cmTarget::GetMakefile(this->Target->Target);
  this->Makefile = pcVar4;
  pcVar5 = cmGeneratorTarget::GetLocalGenerator(this->Target);
  pcVar6 = cmLocalGenerator::GetGlobalGenerator(pcVar5);
  this->GlobalGenerator = pcVar6;
  pcVar7 = cmGlobalGenerator::GetCMakeInstance(this->GlobalGenerator);
  this->CMakeInstance = pcVar7;
  std::__cxx11::string::operator=((string *)&this->LinkLanguage,(string *)linkLanguage);
  sVar11 = ::cm::operator____s("LINK_LIBRARY_OVERRIDE_",0x16);
  pcStack_50 = sVar11.super_string_view._M_str;
  keys = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)sVar11.super_string_view._M_len;
  p_Stack_48 = (_Base_ptr)keys;
  lloPrefix._M_len = (size_t)pcStack_50;
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_78,this->Target);
  local_60 = &local_78;
  cVar8 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::cbegin(local_60);
  __last = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::cend(local_60);
  __f.lloPrefix = (string_view *)&p_Stack_48;
  __f.this = this;
  __f.config = config;
  __f.linkLanguage = linkLanguage;
  std::
  for_each<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmComputeLinkDepends::cmComputeLinkDepends(cmGeneratorTarget_const*,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
            ((anon_class_32_4_b747d6b6 *)&linkLibraryOverride,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )cVar8._M_current,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )__last._M_current,__f);
  this_00 = this->Target;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"LINK_LIBRARY_OVERRIDE",(allocator<char> *)&dag.field_0x7f);
  local_d0 = cmGeneratorTarget::GetProperty(this_00,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&dag.field_0x7f);
  bVar1 = cmValue::operator_cast_to_bool(&local_d0);
  if (bVar1) {
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_188);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"LINK_LIBRARY_OVERRIDE",
               (allocator<char> *)(overrideValue.field_2._M_local_buf + 0xf));
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)(local_188 + 0x10),
               (cmListFileBacktrace *)local_188,target,&local_1a8,(GeneratorExpressionContent *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)(overrideValue.field_2._M_local_buf + 0xf));
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_188);
    psVar9 = cmValue::operator*[abi_cxx11_(&local_d0);
    std::__cxx11::string::string
              ((string *)
               &overrideList.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)psVar9);
    pcVar5 = cmGeneratorTarget::GetLocalGenerator(target);
    cmGeneratorExpression::Evaluate
              ((string *)local_1d0,
               (string *)
               &overrideList.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar5,config,target,
               (cmGeneratorExpressionDAGChecker *)(local_188 + 0x10),target,linkLanguage);
    std::__cxx11::string::~string
              ((string *)
               &overrideList.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_218 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1d0);
    sep = (string_view)::cm::operator____s(",",1);
    pcStack_230 = sep._M_str;
    feature = (value_type *)sep._M_len;
    local_228 = feature;
    pcStack_220 = pcStack_230;
    cmTokenize_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_208,local_218,sep);
    sVar10 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_208);
    if (1 < sVar10) {
      local_240 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_208);
      local_250._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::cbegin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_208);
      local_248 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator+(&local_250,1);
      cVar8 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::cend((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_208);
      __f_00.feature = local_240;
      __f_00.this = this;
      std::
      for_each<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmComputeLinkDepends::cmComputeLinkDepends(cmGeneratorTarget_const*,std::__cxx11::string_const&,std::__cxx11::string_const&)::__1>
                (local_248,
                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )cVar8._M_current,__f_00);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_208);
    std::__cxx11::string::~string((string *)local_1d0);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)(local_188 + 0x10));
  }
  bVar2 = std::__cxx11::string::empty();
  this->HasConfig = (bool)((bVar2 ^ 0xff) & 1);
  if ((this->HasConfig & 1U) == 0) {
    std::__cxx11::string::string
              ((string *)
               &debugConfigs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    std::__cxx11::string::string
              ((string *)
               &debugConfigs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)config);
  }
  std::__cxx11::string::operator=
            ((string *)&this->Config,
             (string *)
             &debugConfigs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &debugConfigs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar7 = cmMakefile::GetCMakeInstance(this->Makefile);
  cmake::GetDebugConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2b0,pcVar7);
  cVar3 = CMP0003_ComputeLinkType
                    (&this->Config,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2b0);
  this->LinkType = cVar3;
  pcVar4 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"CMAKE_LINK_DEPENDS_DEBUG_MODE",&local_2d1);
  bVar1 = cmMakefile::IsOn(pcVar4,&local_2d0);
  this->DebugMode = bVar1;
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  this->OldLinkDirMode = false;
  std::unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>::operator=
            (&this->CCG,(nullptr_t)0x0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return;
}

Assistant:

cmComputeLinkDepends::cmComputeLinkDepends(const cmGeneratorTarget* target,
                                           const std::string& config,
                                           const std::string& linkLanguage)
{
  // Store context information.
  this->Target = target;
  this->Makefile = this->Target->Target->GetMakefile();
  this->GlobalGenerator =
    this->Target->GetLocalGenerator()->GetGlobalGenerator();
  this->CMakeInstance = this->GlobalGenerator->GetCMakeInstance();
  this->LinkLanguage = linkLanguage;

  // target oriented feature override property takes precedence over
  // global override property
  cm::string_view lloPrefix = "LINK_LIBRARY_OVERRIDE_"_s;
  auto const& keys = this->Target->GetPropertyKeys();
  std::for_each(
    keys.cbegin(), keys.cend(),
    [this, &lloPrefix, &config, &linkLanguage](std::string const& key) {
      if (cmHasPrefix(key, lloPrefix)) {
        if (cmValue feature = this->Target->GetProperty(key)) {
          if (!feature->empty() && key.length() > lloPrefix.length()) {
            auto item = key.substr(lloPrefix.length());
            cmGeneratorExpressionDAGChecker dag{ this->Target->GetBacktrace(),
                                                 this->Target,
                                                 "LINK_LIBRARY_OVERRIDE",
                                                 nullptr, nullptr };
            auto overrideFeature = cmGeneratorExpression::Evaluate(
              *feature, this->Target->GetLocalGenerator(), config,
              this->Target, &dag, this->Target, linkLanguage);
            this->LinkLibraryOverride.emplace(item, overrideFeature);
          }
        }
      }
    });
  // global override property
  if (cmValue linkLibraryOverride =
        this->Target->GetProperty("LINK_LIBRARY_OVERRIDE")) {
    cmGeneratorExpressionDAGChecker dag{ target->GetBacktrace(), target,
                                         "LINK_LIBRARY_OVERRIDE", nullptr,
                                         nullptr };
    auto overrideValue = cmGeneratorExpression::Evaluate(
      *linkLibraryOverride, target->GetLocalGenerator(), config, target, &dag,
      target, linkLanguage);

    auto overrideList = cmTokenize(overrideValue, ","_s);
    if (overrideList.size() >= 2) {
      auto const& feature = overrideList.front();
      for_each(overrideList.cbegin() + 1, overrideList.cend(),
               [this, &feature](std::string const& item) {
                 this->LinkLibraryOverride.emplace(item, feature);
               });
    }
  }

  // The configuration being linked.
  this->HasConfig = !config.empty();
  this->Config = (this->HasConfig) ? config : std::string();
  std::vector<std::string> debugConfigs =
    this->Makefile->GetCMakeInstance()->GetDebugConfigs();
  this->LinkType = CMP0003_ComputeLinkType(this->Config, debugConfigs);

  // Enable debug mode if requested.
  this->DebugMode = this->Makefile->IsOn("CMAKE_LINK_DEPENDS_DEBUG_MODE");

  // Assume no compatibility until set.
  this->OldLinkDirMode = false;

  // No computation has been done.
  this->CCG = nullptr;
}